

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O1

hrgls_Status
hrgls_DataBlobSourceGetNextBlob(hrgls_DataBlobSource stream,hrgls_DataBlob *blob,timeval timeout)

{
  hrgls_Status hVar1;
  undefined4 uVar2;
  hrgls_DataBlob blobToCopy;
  timeval timeout_00;
  DataBlob f;
  DataBlobSource local_20;
  
  timeout_00.tv_usec = timeout.tv_sec;
  if (stream == (hrgls_DataBlobSource)0x0) {
    hVar1 = 0x3ee;
  }
  else if (blob == (hrgls_DataBlob *)0x0) {
    hVar1 = 0x3e9;
  }
  else {
    timeout_00.tv_sec = (__time_t)stream->stream;
    hrgls::datablob::DataBlobSource::GetNextBlob(&local_20,timeout_00);
    blobToCopy = (hrgls_DataBlob)0x0;
    if (local_20.m_private != (DataBlobSource_private *)0x0) {
      blobToCopy = (hrgls_DataBlob)(local_20.m_private)->api;
      uVar2 = 0;
      if (blobToCopy == (hrgls_DataBlob)0x0) {
        uVar2 = 0x3ee;
      }
      *(undefined4 *)&((local_20.m_private)->streamName)._M_dataplus._M_p = uVar2;
    }
    hVar1 = hrgls_DataBlobCopy(blob,blobToCopy);
    if (hVar1 == 0) {
      hVar1 = hrgls::datablob::DataBlobSource::GetStatus(stream->stream);
    }
    hrgls::datablob::DataBlob::~DataBlob((DataBlob *)&local_20);
  }
  return hVar1;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceGetNextBlob(hrgls_DataBlobSource stream,
    hrgls_DataBlob * blob, struct timeval timeout)
  {
    if (!stream) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!blob) {
      return hrgls_STATUS_BAD_PARAMETER;
    }
    try {
      hrgls::datablob::DataBlob f = stream->stream->GetNextBlob(timeout);
      hrgls_Status s = hrgls_DataBlobCopy(blob, f.RawDataBlob());
      if (s != hrgls_STATUS_OKAY) {
        return s;
      }
      return stream->stream->GetStatus();
    }
    catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }
  }